

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O3

void __thiscall xmrig::Httpd::onHttpData(Httpd *this,HttpData *data)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  int iVar2;
  Api *this_00;
  Config *pCVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  bool bVar6;
  HttpApiResponse local_f0;
  key_type local_50;
  
  iVar2 = data->method;
  if (iVar2 == 1) {
    iVar2 = std::__cxx11::string::compare((char *)&data->url);
    if (iVar2 == 0) {
      HttpResponse::HttpResponse(&local_f0.super_HttpResponse,data->m_id,0x194);
      HttpResponse::end(&local_f0.super_HttpResponse,(char *)0x0,0);
      goto LAB_00150ac6;
    }
    iVar2 = data->method;
LAB_00150a4f:
    if (iVar2 < 5) {
      iVar2 = auth(this,data);
      if (iVar2 == 200) {
        if (data->method == 1) {
LAB_00150a8b:
          this_00 = Base::api(this->m_base);
          Api::request(this_00,data);
          return;
        }
        pCVar3 = Base::config(this->m_base);
        if ((pCVar3->super_BaseConfig).m_http.m_restricted == true) {
          HttpApiResponse::HttpApiResponse(&local_f0,data->m_id,0x193);
          HttpApiResponse::end(&local_f0);
        }
        else {
          pmVar1 = &local_f0.super_HttpResponse.m_headers;
          local_f0.super_HttpResponse.m_id = (uint64_t)pmVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"content-type","");
          cVar4 = std::
                  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&(data->headers)._M_t,(key_type *)&local_f0);
          if ((_Rb_tree_header *)cVar4._M_node ==
              &(data->headers)._M_t._M_impl.super__Rb_tree_header) {
            bVar6 = true;
          }
          else {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"content-type","");
            pmVar5 = std::
                     map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&data->headers,&local_50);
            iVar2 = std::__cxx11::string::compare((char *)pmVar5);
            bVar6 = iVar2 != 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          if ((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_f0.super_HttpResponse.m_id != pmVar1) {
            operator_delete((void *)local_f0.super_HttpResponse.m_id);
          }
          if (!bVar6) goto LAB_00150a8b;
          HttpApiResponse::HttpApiResponse(&local_f0,data->m_id,0x19f);
          HttpApiResponse::end(&local_f0);
        }
      }
      else {
        HttpApiResponse::HttpApiResponse(&local_f0,data->m_id,iVar2);
        HttpApiResponse::end(&local_f0);
      }
    }
    else {
      HttpApiResponse::HttpApiResponse(&local_f0,data->m_id,0x195);
      HttpApiResponse::end(&local_f0);
    }
  }
  else {
    if (iVar2 != 6) goto LAB_00150a4f;
    HttpApiResponse::HttpApiResponse(&local_f0,data->m_id);
    HttpApiResponse::end(&local_f0);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_f0.m_doc);
LAB_00150ac6:
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f0.super_HttpResponse.m_headers._M_t);
  return;
}

Assistant:

void xmrig::Httpd::onHttpData(const HttpData &data)
{
    if (data.method == HTTP_OPTIONS) {
        return HttpApiResponse(data.id()).end();
    }

    if (data.method == HTTP_GET && data.url == "/favicon.ico") {
#       ifdef _WIN32
        if (favicon != nullptr) {
            HttpResponse response(data.id());
            response.setHeader("Content-Type", "image/x-icon");

            return response.end(favicon, faviconSize);
        }
#       endif

        return HttpResponse(data.id(), 404).end();
    }

    if (data.method > 4) {
        return HttpApiResponse(data.id(), HTTP_STATUS_METHOD_NOT_ALLOWED).end();
    }

    const int status = auth(data);
    if (status != HTTP_STATUS_OK) {
        return HttpApiResponse(data.id(), status).end();
    }

    if (data.method != HTTP_GET) {
        if (m_base->config()->http().isRestricted()) {
            return HttpApiResponse(data.id(), HTTP_STATUS_FORBIDDEN).end();
        }

        if (!data.headers.count(kContentType) || data.headers.at(kContentType) != "application/json") {
            return HttpApiResponse(data.id(), HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE).end();
        }
    }

    m_base->api()->request(data);
}